

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

bool_t NodeFindDef(node *p,tchar_t *Token,datadef *DataDef)

{
  char cVar1;
  int iVar2;
  fourcc_t fVar3;
  bool_t bVar4;
  dataid Id;
  char *pcVar5;
  
  if (*Token == '_') {
    cVar1 = Token[1];
    if (cVar1 != '\0') {
      pcVar5 = Token + 2;
      do {
        iVar2 = Hex((int)cVar1);
        if (iVar2 < 0) goto LAB_00116ea1;
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != '\0');
    }
    iVar2 = StringToInt(Token + 1,1);
    Id = (dataid)iVar2;
  }
  else {
LAB_00116ea1:
    if (p == (node *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x422,"bool_t NodeFindDef(node *, const tchar_t *, datadef *)");
    }
    Id = (**(code **)((long)p->VMT + 0x38))(p,Token);
    if (Id == 0) {
      fVar3 = StringToFourCC(Token,0);
      Id = (dataid)fVar3;
    }
  }
  bVar4 = NodeDataDef(p,Id,DataDef);
  return bVar4;
}

Assistant:

bool_t NodeFindDef(node* p,const tchar_t* Token,datadef* DataDef)
{
    dataid Id;
    if (Token[0]=='_' && CheckHex(Token+1))
        Id = StringToInt(Token+1,1);
    else
    {
        Id = Node_FindParam(p,Token);
        if (!Id)
            Id = StringToFourCC(Token,0);
    }
    return NodeDataDef(p,Id,DataDef);
}